

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_setup(Curl_easy *data)

{
  connectdata *pcVar1;
  undefined8 *puVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t byte_count;
  uchar nt [24];
  uchar local_4a8 [8];
  uchar nt_hash [21];
  undefined8 local_488;
  uchar lm [24];
  uchar local_468 [8];
  uchar lm_hash [21];
  char *p;
  undefined2 local_440;
  undefined1 uStack_43e;
  smb_setup msg;
  smb_conn *smbc;
  connectdata *conn;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  msg.bytes._1016_8_ = &pcVar1->proto;
  register0x00000000 = (char *)((long)&msg.pad + 2);
  sVar3 = strlen((char *)(pcVar1->proto).ftpc.pp.cache_size);
  sVar4 = strlen(*(char **)(msg.bytes._1016_8_ + 0x10));
  if (sVar3 + sVar4 + 0x3d < 0x401) {
    Curl_ntlm_core_mk_lm_hash(data,pcVar1->passwd,local_468);
    Curl_ntlm_core_lm_resp(local_468,(uchar *)(msg.bytes._1016_8_ + 0x20),(uchar *)&local_488);
    Curl_ntlm_core_mk_nt_hash(data,pcVar1->passwd,local_4a8);
    Curl_ntlm_core_lm_resp(local_4a8,(uchar *)(msg.bytes._1016_8_ + 0x20),(uchar *)&byte_count);
    memset((void *)((long)&p + 3),0,0x41d);
    puVar2 = (undefined8 *)stack0xfffffffffffffbb0;
    p._3_1_ = 0xd;
    p._4_1_ = 0xff;
    local_440 = 0x9000;
    _uStack_43e = 1;
    msg.andx.command = '\x01';
    msg.andx.pad = '\0';
    msg._3_4_ = *(undefined4 *)(msg.bytes._1016_8_ + 0x28);
    msg.lengths[0] = 8;
    msg.lengths[1] = 0;
    msg.max_mpx_count = 0x18;
    msg.vc_number = 0x18;
    *(undefined8 *)stack0xfffffffffffffbb0 = local_488;
    puVar2[1] = lm._0_8_;
    puVar2[2] = lm._8_8_;
    puVar2 = (undefined8 *)stack0xfffffffffffffbb0;
    register0x00000000 = (char *)((long)stack0xfffffffffffffbb0 + 0x18);
    *(size_t *)register0x00000000 = byte_count;
    puVar2[4] = nt._0_8_;
    puVar2[5] = nt._8_8_;
    register0x00000000 = stack0xfffffffffffffbb0 + 0x18;
    strcpy(register0x00000000,*(char **)(msg.bytes._1016_8_ + 8));
    sVar3 = strlen(*(char **)(msg.bytes._1016_8_ + 8));
    register0x00000000 = stack0xfffffffffffffbb0 + sVar3 + 1;
    strcpy(register0x00000000,*(char **)(msg.bytes._1016_8_ + 0x10));
    sVar3 = strlen(*(char **)(msg.bytes._1016_8_ + 0x10));
    register0x00000000 = stack0xfffffffffffffbb0 + sVar3 + 1;
    strcpy(register0x00000000,"Linux");
    register0x00000000 = stack0xfffffffffffffbb0 + 6;
    strcpy(register0x00000000,"curl");
    register0x00000000 = stack0xfffffffffffffbb0 + 5;
    lVar5 = (long)register0x00000000 - (long)((long)&msg.pad + 2);
    msg.pad._0_2_ = (undefined2)lVar5;
    data_local._4_4_ = smb_send_message(data,'s',(void *)((long)&p + 3),lVar5 + 0x1d);
  }
  else {
    data_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_setup(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  size_t byte_count = sizeof(lm) + sizeof(nt);
  byte_count += strlen(smbc->user) + strlen(smbc->domain);
  byte_count += strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(data, conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
#ifdef USE_NTRESPONSES
  Curl_ntlm_core_mk_nt_hash(data, conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);
#else
  memset(nt, 0, sizeof(nt));
#endif

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  MSGCATNULL(smbc->user);
  MSGCATNULL(smbc->domain);
  MSGCATNULL(OS);
  MSGCATNULL(CLIENTNAME);
  byte_count = p - msg.bytes;
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}